

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
re2::SparseArray<int>::SetInternal(SparseArray<int> *this,bool allow_existing,int i,int *v)

{
  bool bVar1;
  uint uVar2;
  iterator pIVar3;
  undefined8 in_RCX;
  uint in_EDX;
  undefined1 in_SIL;
  SparseArray<int> *in_RDI;
  SparseArray<int> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int i_00;
  uint uVar4;
  undefined3 in_stack_fffffffffffffff4;
  uint i_01;
  SparseArray<int> *this_00;
  int i_02;
  
  i_00 = (int)((ulong)in_RCX >> 0x20);
  i_01 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  this_00 = in_RDI;
  DebugCheckInvariants
            ((SparseArray<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar4 = in_EDX;
  uVar2 = max_size(in_RDI);
  if (uVar2 <= in_EDX) {
    __assert_fail("false && \"illegal index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                  ,0xd5,
                  "iterator re2::SparseArray<int>::SetInternal(bool, int, const Value &) [Value = int]"
                 );
  }
  if ((i_01 & 0x1000000) == 0) {
    bVar1 = has_index(this_00,i_01);
    i_02 = (int)((ulong)this_00 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!has_index(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                    ,0xdc,
                    "iterator re2::SparseArray<int>::SetInternal(bool, int, const Value &) [Value = int]"
                   );
    }
    create_index((SparseArray<int> *)CONCAT44(i_01,uVar4),i_00);
  }
  else {
    bVar1 = has_index(this_00,i_01);
    i_02 = (int)((ulong)this_00 >> 0x20);
    if (!bVar1) {
      create_index((SparseArray<int> *)CONCAT44(i_01,uVar4),i_00);
    }
  }
  pIVar3 = SetExistingInternal(unaff_retaddr,i_02,(int *)CONCAT44(i_01,uVar4));
  return pIVar3;
}

Assistant:

iterator SetInternal(bool allow_existing, int i, const Value& v) {
    DebugCheckInvariants();
    if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
      assert(false && "illegal index");
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return begin();
    }
    if (!allow_existing) {
      assert(!has_index(i));
      create_index(i);
    } else {
      if (!has_index(i))
        create_index(i);
    }
    return SetExistingInternal(i, v);
  }